

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O1

int Abc_NodeFanin1Copy2(Abc_Obj_t *pObj)

{
  uint uVar1;
  
  uVar1 = *(uint *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]] + 0x40);
  if (-1 < (int)uVar1) {
    return *(uint *)&pObj->field_0x14 >> 0xb & 1 ^ uVar1;
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                ,0x10f,"int Abc_LitNotCond(int, int)");
}

Assistant:

static inline Abc_Obj_t * Abc_ObjFanin1( Abc_Obj_t * pObj )          { return (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[ pObj->vFanins.pArray[1] ];   }